

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O1

char * pkg_writeCharList(FileStream *s,CharList *l,char *delim,int32_t quote)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char buffer [1024];
  undefined8 uStack_440;
  char local_438 [1023];
  undefined1 local_39;
  
  if (l != (CharList *)0x0) {
    do {
      if (l->str != (char *)0x0) {
        uStack_440 = (code *)0x1ea84a;
        strncpy(local_438,l->str,0x3ff);
        local_39 = 0;
        pcVar2 = l->str;
        uStack_440 = (code *)0x1ea85d;
        pcVar3 = pcVar2;
        sVar1 = strlen(pcVar2);
        if (0x3fe < sVar1) {
          uStack_440 = pkg_countCharList;
          pkg_writeCharList_cold_1();
          pcVar2 = (char *)0x0;
          for (; pcVar3 != (char *)0x0; pcVar3 = *(char **)(pcVar3 + 8)) {
            pcVar2 = (char *)(ulong)((int)pcVar2 + 1);
          }
          return pcVar2;
        }
        if (quote < 0) {
          uStack_440 = (code *)0x1ea8b4;
          sVar1 = strlen(local_438);
          if (*(char *)((long)&uStack_440 + sVar1 + 7) == '\"') {
            *(undefined1 *)((long)&uStack_440 + sVar1 + 7) = 0;
          }
          if (local_438[0] == '\"') {
            uStack_440 = (code *)0x1ea8d3;
            strcpy(local_438,local_438 + 1);
          }
        }
        else if (quote != 0) {
          if (*pcVar2 != '\"') {
            local_438[0] = '\"';
            local_438[1] = '\0';
            uStack_440 = (code *)0x1ea889;
            strcat(local_438,l->str);
          }
          pcVar2 = l->str;
          uStack_440 = (code *)0x1ea894;
          sVar1 = strlen(pcVar2);
          if (pcVar2[sVar1 - 1] != '\"') {
            uStack_440 = (code *)0x1ea8a4;
            sVar1 = strlen(local_438);
            (local_438 + sVar1)[0] = '\"';
            (local_438 + sVar1)[1] = '\0';
          }
        }
        uStack_440 = (code *)0x1ea8db;
        sVar1 = strlen(local_438);
        uStack_440 = (code *)0x1ea8e8;
        T_FileStream_write(s,local_438,(int32_t)sVar1);
      }
      if ((delim != (char *)0x0) && (l->next != (_CharList *)0x0)) {
        uStack_440 = (code *)0x1ea8fc;
        sVar1 = strlen(delim);
        uStack_440 = (code *)0x1ea909;
        T_FileStream_write(s,delim,(int32_t)sVar1);
      }
      l = l->next;
    } while (l != (_CharList *)0x0);
  }
  return (char *)0x0;
}

Assistant:

const char *pkg_writeCharList(FileStream *s, CharList *l, const char *delim, int32_t quote)
{
    char buffer[1024];
    while(l != NULL)
    {
        if(l->str)
        {
            uprv_strncpy(buffer, l->str, 1023);
            buffer[1023]=0;
            if(uprv_strlen(l->str) >= 1023)
            {
                fprintf(stderr, "%s:%d: Internal error, line too long (greater than 1023 chars)\n",
                        __FILE__, __LINE__);
                exit(0);
            }
            if(quote < 0) { /* remove quotes */
                if(buffer[uprv_strlen(buffer)-1] == '"') {
                    buffer[uprv_strlen(buffer)-1] = '\0';
                }
                if(buffer[0] == '"') {
                    uprv_strcpy(buffer, buffer+1);
                }
            } else if(quote > 0) { /* add quotes */
                if(l->str[0] != '"') {
                    uprv_strcpy(buffer, "\"");
                    uprv_strcat(buffer, l->str);
                }
                if(l->str[uprv_strlen(l->str)-1] != '"') {
                    uprv_strcat(buffer, "\"");
                }
            }
            T_FileStream_write(s, buffer, (int32_t)uprv_strlen(buffer));
        }

        if(l->next && delim)
        {
            T_FileStream_write(s, delim, (int32_t)uprv_strlen(delim));
        }
        l = l->next;
    }
    return NULL;
}